

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfdcapi_elements_transaction.cpp
# Opt level: O0

void __thiscall
cfdcapi_elements_transaction_AddSignConfidentialTxEmptyWitness_Test::TestBody
          (cfdcapi_elements_transaction_AddSignConfidentialTxEmptyWitness_Test *this)

{
  bool bVar1;
  char *pcVar2;
  char *message;
  char *in_R9;
  bool in_stack_00000107;
  char *in_stack_00000108;
  int in_stack_00000110;
  uint32_t in_stack_00000114;
  char *in_stack_00000118;
  char *in_stack_00000120;
  void *in_stack_00000128;
  char *in_stack_00000140;
  int64_t in_stack_00000148;
  char *in_stack_00000150;
  int in_stack_00000158;
  char **in_stack_00000168;
  AssertionResult gtest_ar_12;
  AssertionResult gtest_ar_11;
  AssertionResult gtest_ar_10;
  char *str_buffer;
  AssertionResult gtest_ar_9;
  AssertionResult gtest_ar_8;
  AssertionResult gtest_ar_7;
  AssertionResult gtest_ar_6;
  AssertionResult gtest_ar_5;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  char *signature;
  int64_t satoshi;
  char *sighash;
  AssertionResult gtest_ar_1;
  char *tx_string2;
  char *tx_string;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  int ret;
  void *handle;
  bool *in_stack_fffffffffffffbf8;
  AssertionResult *in_stack_fffffffffffffc00;
  char **rhs;
  CfdErrorCode *in_stack_fffffffffffffc08;
  char **in_stack_fffffffffffffc10;
  undefined4 in_stack_fffffffffffffc18;
  undefined4 in_stack_fffffffffffffc1c;
  undefined7 in_stack_fffffffffffffc38;
  undefined1 in_stack_fffffffffffffc3f;
  AssertionResult *in_stack_fffffffffffffc90;
  undefined7 in_stack_fffffffffffffc98;
  undefined1 in_stack_fffffffffffffc9f;
  AssertHelper local_290;
  Message local_288;
  undefined4 local_27c;
  AssertionResult local_278;
  AssertHelper local_268;
  Message local_260;
  AssertionResult local_258;
  AssertHelper local_248;
  Message local_240;
  undefined4 local_234;
  undefined1 in_stack_fffffffffffffdd6;
  undefined1 in_stack_fffffffffffffdd7;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffdd8;
  undefined8 in_stack_fffffffffffffde0;
  AssertHelper in_stack_fffffffffffffde8;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffdf0;
  void *in_stack_fffffffffffffdf8;
  AssertHelper local_1f8;
  int in_stack_fffffffffffffe10;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffe28;
  AssertHelper local_1d0;
  Message local_1c8;
  undefined4 local_1bc;
  AssertionResult local_1b8;
  AssertHelper local_1a8;
  Message local_1a0;
  undefined4 local_194;
  AssertionResult local_190;
  AssertHelper local_180;
  Message local_178;
  undefined4 local_16c;
  AssertionResult local_168;
  AssertHelper local_158;
  Message local_150;
  undefined4 local_144;
  AssertionResult local_140;
  AssertHelper local_130;
  Message local_128 [2];
  undefined1 in_stack_fffffffffffffeeb;
  int in_stack_fffffffffffffeec;
  undefined7 in_stack_fffffffffffffef0;
  undefined1 in_stack_fffffffffffffef7;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffef8;
  undefined4 in_stack_ffffffffffffff00;
  undefined1 is_witness;
  uint32_t in_stack_ffffffffffffff04;
  uint32_t vout;
  char *in_stack_ffffffffffffff08;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_ffffffffffffff10;
  void *in_stack_ffffffffffffff18;
  void *handle_00;
  char **signature_00;
  AssertHelper local_d0;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_ffffffffffffff38;
  AssertionResult local_b8;
  char *local_a8;
  char *local_a0;
  string local_98;
  AssertHelper local_78;
  Message local_70;
  undefined1 local_61;
  AssertionResult local_60;
  AssertHelper local_50;
  Message local_48 [3];
  undefined4 local_2c;
  AssertionResult local_28;
  int local_14;
  long local_10;
  
  local_10 = 0;
  local_14 = CfdCreateHandle((void **)CONCAT44(in_stack_fffffffffffffc1c,in_stack_fffffffffffffc18))
  ;
  local_2c = 0;
  testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
            ((char *)CONCAT44(in_stack_fffffffffffffc1c,in_stack_fffffffffffffc18),
             (char *)in_stack_fffffffffffffc10,in_stack_fffffffffffffc08,
             (int *)in_stack_fffffffffffffc00);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_28);
  if (!bVar1) {
    testing::Message::Message(local_48);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x34c83a);
    testing::internal::AssertHelper::AssertHelper
              (&local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
               ,0x528,pcVar2);
    testing::internal::AssertHelper::operator=(&local_50,local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_50);
    testing::Message::~Message((Message *)0x34c89d);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x34c8f2);
  local_61 = local_10 != 0;
  testing::AssertionResult::AssertionResult<bool>
            (in_stack_fffffffffffffc00,in_stack_fffffffffffffbf8,(type *)0x34c926);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_60);
  if (!bVar1) {
    testing::Message::Message(&local_70);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_98,(internal *)&local_60,(AssertionResult *)"(NULL == handle)","true","false",
               in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
               ,0x529,pcVar2);
    testing::internal::AssertHelper::operator=(&local_78,&local_70);
    testing::internal::AssertHelper::~AssertHelper(&local_78);
    std::__cxx11::string::~string((string *)&local_98);
    testing::Message::~Message((Message *)0x34ca22);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x34ca9d);
  local_a0 = (char *)0x0;
  local_a8 = (char *)0x0;
  rhs = &local_a0;
  local_14 = CfdAddConfidentialTxSign
                       (in_stack_ffffffffffffff18,(char *)in_stack_ffffffffffffff10.ptr_,
                        in_stack_ffffffffffffff08,in_stack_ffffffffffffff04,
                        SUB41((uint)in_stack_ffffffffffffff00 >> 0x18,0),
                        (char *)in_stack_fffffffffffffef8.ptr_,(bool)in_stack_fffffffffffffef7,
                        (char **)in_stack_ffffffffffffff38.ptr_);
  testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
            ((char *)CONCAT44(in_stack_fffffffffffffc1c,in_stack_fffffffffffffc18),
             (char *)in_stack_fffffffffffffc10,in_stack_fffffffffffffc08,(int *)rhs);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_b8);
  if (!bVar1) {
    testing::Message::Message((Message *)&stack0xffffffffffffff38);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x34cba8);
    testing::internal::AssertHelper::AssertHelper
              (&local_d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
               ,0x530,pcVar2);
    testing::internal::AssertHelper::operator=(&local_d0,(Message *)&stack0xffffffffffffff38);
    testing::internal::AssertHelper::~AssertHelper(&local_d0);
    testing::Message::~Message((Message *)0x34cc0b);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x34cc63);
  if (local_14 == 0) {
    signature_00 = (char **)0xbd2cc61d000;
    handle_00 = (void *)0x0;
    rhs = (char **)0xbd2cc61d000;
    in_stack_fffffffffffffc18 = 0;
    in_stack_fffffffffffffc10 = (char **)CONCAT44((int)((ulong)in_stack_fffffffffffffc10 >> 0x20),1)
    ;
    in_stack_fffffffffffffc08 = (CfdErrorCode *)0x0;
    local_14 = CfdCreateConfidentialSighash
                         (in_stack_00000128,in_stack_00000120,in_stack_00000118,in_stack_00000114,
                          in_stack_00000110,in_stack_00000108,in_stack_00000140,in_stack_00000148,
                          in_stack_00000150,in_stack_00000158,in_stack_00000107,in_stack_00000168);
    vout = 0;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)CONCAT44(in_stack_fffffffffffffc1c,in_stack_fffffffffffffc18),
               (char *)in_stack_fffffffffffffc10,in_stack_fffffffffffffc08,(int *)rhs);
    bVar1 = testing::AssertionResult::operator_cast_to_bool
                      ((AssertionResult *)&stack0xffffffffffffff08);
    if (!bVar1) {
      testing::Message::Message((Message *)&stack0xfffffffffffffef8);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x34cdb1);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&stack0xfffffffffffffef0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                 ,0x539,pcVar2);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&stack0xfffffffffffffef0,(Message *)&stack0xfffffffffffffef8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xfffffffffffffef0);
      testing::Message::~Message((Message *)0x34ce14);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x34ce69);
    if (local_14 == 0) {
      testing::internal::CmpHelperSTREQ
                ((internal *)(local_128 + 1),
                 "\"d17f091203341a0d1f0101c6d010a40ce0f3cef8a09b2b605b77bb6cfc23359f\"","sighash",
                 "d17f091203341a0d1f0101c6d010a40ce0f3cef8a09b2b605b77bb6cfc23359f",(char *)0x0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)(local_128 + 1));
      if (!bVar1) {
        testing::Message::Message(local_128);
        pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x34cf18);
        testing::internal::AssertHelper::AssertHelper
                  (&local_130,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                   ,0x53b,pcVar2);
        testing::internal::AssertHelper::operator=(&local_130,local_128);
        testing::internal::AssertHelper::~AssertHelper(&local_130);
        testing::Message::~Message((Message *)0x34cf7b);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x34cfd3);
      local_14 = CfdCalculateEcSignature
                           (in_stack_ffffffffffffff08,
                            (char *)CONCAT44(vout,in_stack_ffffffffffffff00),
                            (char *)in_stack_fffffffffffffef8.ptr_,
                            (char *)CONCAT17(in_stack_fffffffffffffef7,in_stack_fffffffffffffef0),
                            in_stack_fffffffffffffeec,(bool)in_stack_fffffffffffffeeb,signature_00);
      local_144 = 0;
      testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
                ((char *)CONCAT44(in_stack_fffffffffffffc1c,in_stack_fffffffffffffc18),
                 (char *)in_stack_fffffffffffffc10,in_stack_fffffffffffffc08,(int *)rhs);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_140);
      if (!bVar1) {
        testing::Message::Message(&local_150);
        pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x34d0c1);
        testing::internal::AssertHelper::AssertHelper
                  (&local_158,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                   ,0x53f,pcVar2);
        testing::internal::AssertHelper::operator=(&local_158,&local_150);
        testing::internal::AssertHelper::~AssertHelper(&local_158);
        testing::Message::~Message((Message *)0x34d124);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x34d17c);
      if (local_14 == 0) {
        in_stack_fffffffffffffc10 = &local_a8;
        in_stack_fffffffffffffc08 =
             (CfdErrorCode *)((ulong)in_stack_fffffffffffffc08 & 0xffffffff00000000);
        rhs = (char **)((ulong)rhs & 0xffffffff00000000);
        local_14 = CfdAddConfidentialTxDerSign
                             (in_stack_fffffffffffffdf8,(char *)in_stack_fffffffffffffdf0.ptr_,
                              (char *)in_stack_fffffffffffffde8.data_,
                              (uint32_t)((ulong)in_stack_fffffffffffffde0 >> 0x20),
                              SUB81((ulong)in_stack_fffffffffffffde0 >> 0x18,0),
                              (char *)in_stack_fffffffffffffdd8.ptr_,in_stack_fffffffffffffe10,
                              (bool)in_stack_fffffffffffffdd7,(bool)in_stack_fffffffffffffdd6,
                              (char **)in_stack_fffffffffffffe28.ptr_);
        local_16c = 0;
        testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
                  ((char *)CONCAT44(in_stack_fffffffffffffc1c,in_stack_fffffffffffffc18),
                   (char *)in_stack_fffffffffffffc10,in_stack_fffffffffffffc08,(int *)rhs);
        bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_168);
        if (!bVar1) {
          testing::Message::Message(&local_178);
          pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x34d28d);
          testing::internal::AssertHelper::AssertHelper
                    (&local_180,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                     ,0x544,pcVar2);
          testing::internal::AssertHelper::operator=(&local_180,&local_178);
          testing::internal::AssertHelper::~AssertHelper(&local_180);
          testing::Message::~Message((Message *)0x34d2f0);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)0x34d345);
        CfdFreeStringBuffer((char *)in_stack_fffffffffffffc08);
      }
    }
    if (local_14 == 0) {
      CfdFreeStringBuffer((char *)in_stack_fffffffffffffc08);
      local_a0 = (char *)0x0;
      local_14 = CfdCalculateEcSignature
                           (in_stack_ffffffffffffff08,
                            (char *)CONCAT44(vout,in_stack_ffffffffffffff00),
                            (char *)in_stack_fffffffffffffef8.ptr_,
                            (char *)CONCAT17(in_stack_fffffffffffffef7,in_stack_fffffffffffffef0),
                            in_stack_fffffffffffffeec,(bool)in_stack_fffffffffffffeeb,signature_00);
      local_194 = 0;
      testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
                ((char *)CONCAT44(in_stack_fffffffffffffc1c,in_stack_fffffffffffffc18),
                 (char *)in_stack_fffffffffffffc10,in_stack_fffffffffffffc08,(int *)rhs);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_190);
      if (!bVar1) {
        testing::Message::Message(&local_1a0);
        pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x34d46b);
        testing::internal::AssertHelper::AssertHelper
                  (&local_1a8,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                   ,0x54f,pcVar2);
        testing::internal::AssertHelper::operator=(&local_1a8,&local_1a0);
        testing::internal::AssertHelper::~AssertHelper(&local_1a8);
        testing::Message::~Message((Message *)0x34d4ce);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x34d526);
      if (local_14 == 0) {
        in_stack_fffffffffffffc10 = &local_a0;
        in_stack_fffffffffffffc08 =
             (CfdErrorCode *)((ulong)in_stack_fffffffffffffc08 & 0xffffffff00000000);
        rhs = (char **)((ulong)rhs & 0xffffffff00000000);
        local_14 = CfdAddConfidentialTxDerSign
                             (in_stack_fffffffffffffdf8,(char *)in_stack_fffffffffffffdf0.ptr_,
                              (char *)in_stack_fffffffffffffde8.data_,
                              (uint32_t)((ulong)in_stack_fffffffffffffde0 >> 0x20),
                              SUB81((ulong)in_stack_fffffffffffffde0 >> 0x18,0),
                              (char *)in_stack_fffffffffffffdd8.ptr_,in_stack_fffffffffffffe10,
                              (bool)in_stack_fffffffffffffdd7,(bool)in_stack_fffffffffffffdd6,
                              (char **)in_stack_fffffffffffffe28.ptr_);
        local_1bc = 0;
        testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
                  ((char *)CONCAT44(in_stack_fffffffffffffc1c,in_stack_fffffffffffffc18),
                   (char *)in_stack_fffffffffffffc10,in_stack_fffffffffffffc08,(int *)rhs);
        bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1b8);
        if (!bVar1) {
          testing::Message::Message(&local_1c8);
          pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x34d637);
          testing::internal::AssertHelper::AssertHelper
                    (&local_1d0,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                     ,0x554,pcVar2);
          testing::internal::AssertHelper::operator=(&local_1d0,&local_1c8);
          testing::internal::AssertHelper::~AssertHelper(&local_1d0);
          testing::Message::~Message((Message *)0x34d69a);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)0x34d6ef);
        CfdFreeStringBuffer((char *)in_stack_fffffffffffffc08);
      }
    }
    is_witness = (undefined1)((uint)in_stack_ffffffffffffff00 >> 0x18);
    if (local_14 == 0) {
      CfdFreeStringBuffer((char *)in_stack_fffffffffffffc08);
      local_a8 = (char *)0x0;
      rhs = &local_a8;
      local_14 = CfdAddConfidentialTxSign
                           (handle_00,(char *)in_stack_ffffffffffffff10.ptr_,
                            in_stack_ffffffffffffff08,vout,(bool)is_witness,
                            (char *)in_stack_fffffffffffffef8.ptr_,(bool)in_stack_fffffffffffffef7,
                            (char **)in_stack_ffffffffffffff38.ptr_);
      in_stack_fffffffffffffc90 = (AssertionResult *)&stack0xfffffffffffffe20;
      testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
                ((char *)CONCAT44(in_stack_fffffffffffffc1c,in_stack_fffffffffffffc18),
                 (char *)in_stack_fffffffffffffc10,in_stack_fffffffffffffc08,(int *)rhs);
      in_stack_fffffffffffffc9f =
           testing::AssertionResult::operator_cast_to_bool(in_stack_fffffffffffffc90);
      if (!(bool)in_stack_fffffffffffffc9f) {
        testing::Message::Message((Message *)&stack0xfffffffffffffe10);
        pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x34d81b);
        testing::internal::AssertHelper::AssertHelper
                  (&local_1f8,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                   ,0x560,pcVar2);
        testing::internal::AssertHelper::operator=(&local_1f8,(Message *)&stack0xfffffffffffffe10);
        testing::internal::AssertHelper::~AssertHelper(&local_1f8);
        testing::Message::~Message((Message *)0x34d87e);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x34d8d3);
    }
    if (local_14 == 0) {
      testing::internal::CmpHelperSTREQ
                ((internal *)&stack0xfffffffffffffdf8,
                 "\"0200000001020f231181a6d8fa2c5f7020948464110fbcc925f94d673d5752ce66d00250a1570000000000ffffffff0f231181a6d8fa2c5f7020948464110fbcc925f94d673d5752ce66d00250a1570100008000ffffffffd8bbe31bc590cbb6a47d2e53a956ec25d8890aefd60dcfc93efd34727554890b0683fe0819a4f9770c8a7cd5824e82975c825e017aff8ba0d6a5eb4959cf9c6f010000000023c346000004017981c1f171d7973a1fd922652f559f47d6d1506a4be2394b27a54951957f6c1801000000003b947f6002200d8510dfcf8e2330c0795c771d1e6064daab2f274ac32a6e2708df9bfa893d17a914ef3e40882e17d6e477082fcafeb0f09dc32d377b87010bad521bafdac767421d45b71b29a349c7b2ca2a06b5d8e3b5898c91df2769ed010000000029b9270002cc645552109331726c0ffadccab21620dd7a5a33260c6ac7bd1c78b98cb1e35a1976a9146c22e209d36612e0d9d2a20b814d7d8648cc7a7788ac017981c1f171d7973a1fd922652f559f47d6d1506a4be2394b27a54951957f6c1801000000000000c350000001cdb0ed311810e61036ac9255674101497850f5eee5e4320be07479c05473cbac010000000023c3460003ce4c4eac09fe317f365e45c00ffcf2e9639bc0fd792c10f72cdc173c4e5ed8791976a9149bdcb18911fa9faad6632ca43b81739082b0a19588ac00000000000004004730440220795dbf165d3197fe27e2b73d57cacfb8d742029c972b109040c7785aee4e75ea022065f7a985efe82eba1d0e0cafd7cf711bb8c65485bddc4e495315dd92bd7e4a790147304402202ce4acde192e4109832d46970b510158d42fc156c92afff137157ebfc2a03e2a02200b7dfd3a92770d79d29b3c55fb6325b22bce0e1362de74b2dac80d9689b5a89b0147522102bfd7daa5d113fcbd8c2f374ae58cbb89cbed9570e898f1af5ff989457e2d4d712102715ed9a5f16153c5216a6751b7d84eba32076f0b607550a58b209077ab7c30ad52ae00000000000000000000000000\""
                 ,"tx_string2",
                 "0200000001020f231181a6d8fa2c5f7020948464110fbcc925f94d673d5752ce66d00250a1570000000000ffffffff0f231181a6d8fa2c5f7020948464110fbcc925f94d673d5752ce66d00250a1570100008000ffffffffd8bbe31bc590cbb6a47d2e53a956ec25d8890aefd60dcfc93efd34727554890b0683fe0819a4f9770c8a7cd5824e82975c825e017aff8ba0d6a5eb4959cf9c6f010000000023c346000004017981c1f171d7973a1fd922652f559f47d6d1506a4be2394b27a54951957f6c1801000000003b947f6002200d8510dfcf8e2330c0795c771d1e6064daab2f274ac32a6e2708df9bfa893d17a914ef3e40882e17d6e477082fcafeb0f09dc32d377b87010bad521bafdac767421d45b71b29a349c7b2ca2a06b5d8e3b5898c91df2769ed010000000029b9270002cc645552109331726c0ffadccab21620dd7a5a33260c6ac7bd1c78b98cb1e35a1976a9146c22e209d36612e0d9d2a20b814d7d8648cc7a7788ac017981c1f171d7973a1fd922652f559f47d6d1506a4be2394b27a54951957f6c1801000000000000c350000001cdb0ed311810e61036ac9255674101497850f5eee5e4320be07479c05473cbac010000000023c3460003ce4c4eac09fe317f365e45c00ffcf2e9639bc0fd792c10f72cdc173c4e5ed8791976a9149bdcb18911fa9faad6632ca43b81739082b0a19588ac00000000000004004730440220795dbf165d3197fe27e2b73d57cacfb8d742029c972b109040c7785aee4e75ea022065f7a985efe82eba1d0e0cafd7cf711bb8c65485bddc4e495315dd92bd7e4a790147304402202ce4acde192e4109832d46970b510158d42fc156c92afff137157ebfc2a03e2a02200b7dfd3a92770d79d29b3c55fb6325b22bce0e1362de74b2dac80d9689b5a89b0147522102bfd7daa5d113fcbd8c2f374ae58cbb89cbed9570e898f1af5ff989457e2d4d712102715ed9a5f16153c5216a6751b7d84eba32076f0b607550a58b209077ab7c30ad52ae00000000000000000000000000"
                 ,local_a8);
      bVar1 = testing::AssertionResult::operator_cast_to_bool
                        ((AssertionResult *)&stack0xfffffffffffffdf8);
      if (!bVar1) {
        testing::Message::Message((Message *)&stack0xfffffffffffffdf0);
        pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x34d984);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&stack0xfffffffffffffde8,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                   ,0x563,pcVar2);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&stack0xfffffffffffffde8,(Message *)&stack0xfffffffffffffdf0);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xfffffffffffffde8);
        testing::Message::~Message((Message *)0x34d9e1);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x34da36);
    }
    CfdFreeStringBuffer((char *)in_stack_fffffffffffffc08);
    CfdFreeStringBuffer((char *)in_stack_fffffffffffffc08);
    CfdFreeStringBuffer((char *)in_stack_fffffffffffffc08);
  }
  local_14 = CfdGetLastErrorCode((void *)CONCAT17(in_stack_fffffffffffffc3f,
                                                  in_stack_fffffffffffffc38));
  if (local_14 != 0) {
    pcVar2 = (char *)0x0;
    local_14 = CfdGetLastErrorMessage
                         ((void *)CONCAT17(in_stack_fffffffffffffc9f,in_stack_fffffffffffffc98),
                          (char **)in_stack_fffffffffffffc90);
    local_234 = 0;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)CONCAT44(in_stack_fffffffffffffc1c,in_stack_fffffffffffffc18),
               (char *)in_stack_fffffffffffffc10,in_stack_fffffffffffffc08,(int *)rhs);
    bVar1 = testing::AssertionResult::operator_cast_to_bool
                      ((AssertionResult *)&stack0xfffffffffffffdd0);
    if (!bVar1) {
      testing::Message::Message(&local_240);
      message = testing::AssertionResult::failure_message((AssertionResult *)0x34db4a);
      testing::internal::AssertHelper::AssertHelper
                (&local_248,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                 ,0x56f,message);
      testing::internal::AssertHelper::operator=(&local_248,&local_240);
      testing::internal::AssertHelper::~AssertHelper(&local_248);
      testing::Message::~Message((Message *)0x34dba7);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x34dbfc);
    testing::internal::CmpHelperSTREQ((internal *)&local_258,"\"\"","str_buffer","",pcVar2);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_258);
    if (!bVar1) {
      testing::Message::Message(&local_260);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x34dc91);
      testing::internal::AssertHelper::AssertHelper
                (&local_268,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                 ,0x570,pcVar2);
      testing::internal::AssertHelper::operator=(&local_268,&local_260);
      testing::internal::AssertHelper::~AssertHelper(&local_268);
      testing::Message::~Message((Message *)0x34dcee);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x34dd43);
    CfdFreeStringBuffer((char *)in_stack_fffffffffffffc08);
  }
  local_14 = CfdFreeHandle(in_stack_fffffffffffffc08);
  local_27c = 0;
  testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
            ((char *)CONCAT44(in_stack_fffffffffffffc1c,in_stack_fffffffffffffc18),
             (char *)in_stack_fffffffffffffc10,in_stack_fffffffffffffc08,(int *)rhs);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_278);
  if (!bVar1) {
    testing::Message::Message(&local_288);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x34de13);
    testing::internal::AssertHelper::AssertHelper
              (&local_290,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
               ,0x576,pcVar2);
    testing::internal::AssertHelper::operator=(&local_290,&local_288);
    testing::internal::AssertHelper::~AssertHelper(&local_290);
    testing::Message::~Message((Message *)0x34de70);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x34dec5);
  return;
}

Assistant:

TEST(cfdcapi_elements_transaction, AddSignConfidentialTxEmptyWitness) {
  static const char* const kTxData = "0200000000020f231181a6d8fa2c5f7020948464110fbcc925f94d673d5752ce66d00250a1570000000000ffffffff0f231181a6d8fa2c5f7020948464110fbcc925f94d673d5752ce66d00250a1570100008000ffffffffd8bbe31bc590cbb6a47d2e53a956ec25d8890aefd60dcfc93efd34727554890b0683fe0819a4f9770c8a7cd5824e82975c825e017aff8ba0d6a5eb4959cf9c6f010000000023c346000004017981c1f171d7973a1fd922652f559f47d6d1506a4be2394b27a54951957f6c1801000000003b947f6002200d8510dfcf8e2330c0795c771d1e6064daab2f274ac32a6e2708df9bfa893d17a914ef3e40882e17d6e477082fcafeb0f09dc32d377b87010bad521bafdac767421d45b71b29a349c7b2ca2a06b5d8e3b5898c91df2769ed010000000029b9270002cc645552109331726c0ffadccab21620dd7a5a33260c6ac7bd1c78b98cb1e35a1976a9146c22e209d36612e0d9d2a20b814d7d8648cc7a7788ac017981c1f171d7973a1fd922652f559f47d6d1506a4be2394b27a54951957f6c1801000000000000c350000001cdb0ed311810e61036ac9255674101497850f5eee5e4320be07479c05473cbac010000000023c3460003ce4c4eac09fe317f365e45c00ffcf2e9639bc0fd792c10f72cdc173c4e5ed8791976a9149bdcb18911fa9faad6632ca43b81739082b0a19588ac00000000";
  // static const char* pubkey1 = "02715ed9a5f16153c5216a6751b7d84eba32076f0b607550a58b209077ab7c30ad";
  static const char* privkey1 = "cRVLMWHogUo51WECRykTbeLNbm5c57iEpSegjdxco3oef6o5dbFi";
  // static const char* pubkey2 = "02bfd7daa5d113fcbd8c2f374ae58cbb89cbed9570e898f1af5ff989457e2d4d71";
  static const char* privkey2 = "cQUTZ8VbWNYBEtrB7xwe41kqiKMQPRZshTvBHmkoJGaUfmS5pxzR";
  static const char* multisig_script = "522102bfd7daa5d113fcbd8c2f374ae58cbb89cbed9570e898f1af5ff989457e2d4d712102715ed9a5f16153c5216a6751b7d84eba32076f0b607550a58b209077ab7c30ad52ae";

  void* handle = NULL;
  int ret = CfdCreateHandle(&handle);
  EXPECT_EQ(kCfdSuccess, ret);
  EXPECT_FALSE((NULL == handle));

  char* tx_string = nullptr;
  char* tx_string2 = nullptr;
  ret = CfdAddConfidentialTxSign(
      handle, kTxData, "57a15002d066ce52573d674df925c9bc0f1164849420705f2cfad8a68111230f", 0,
      true, "", true, &tx_string);
  EXPECT_EQ(kCfdSuccess, ret);

  if (ret == kCfdSuccess) {
    char* sighash = nullptr;
    int64_t satoshi = 13000000000000;
    char* signature = nullptr;
    ret = CfdCreateConfidentialSighash(
        handle, tx_string, "57a15002d066ce52573d674df925c9bc0f1164849420705f2cfad8a68111230f", 0,
        kCfdP2wsh, nullptr, multisig_script, satoshi, nullptr, kCfdSigHashAll, false, &sighash);
    EXPECT_EQ(kCfdSuccess, ret);
    if (ret == kCfdSuccess) {
      EXPECT_STREQ("d17f091203341a0d1f0101c6d010a40ce0f3cef8a09b2b605b77bb6cfc23359f", sighash);

      ret = CfdCalculateEcSignature(
        handle, sighash, nullptr, privkey2, kCfdNetworkRegtest, true, &signature);
      EXPECT_EQ(kCfdSuccess, ret);
      if (ret == kCfdSuccess) {
        ret = CfdAddConfidentialTxDerSign(
          handle, tx_string, "57a15002d066ce52573d674df925c9bc0f1164849420705f2cfad8a68111230f", 0,
          true, signature, kCfdSigHashAll, false, false, &tx_string2);
        EXPECT_EQ(kCfdSuccess, ret);
        CfdFreeStringBuffer(signature);
      }
    }

    if (ret == kCfdSuccess) {
      CfdFreeStringBuffer(tx_string);
      tx_string = nullptr;

      ret = CfdCalculateEcSignature(
        handle, sighash, nullptr, privkey1, kCfdNetworkRegtest, true, &signature);
      EXPECT_EQ(kCfdSuccess, ret);
      if (ret == kCfdSuccess) {
        ret = CfdAddConfidentialTxDerSign(
          handle, tx_string2, "57a15002d066ce52573d674df925c9bc0f1164849420705f2cfad8a68111230f",
           0, true, signature, kCfdSigHashAll, false, false, &tx_string);
        EXPECT_EQ(kCfdSuccess, ret);
        CfdFreeStringBuffer(signature);
      }
    }

    if (ret == kCfdSuccess) {
      CfdFreeStringBuffer(tx_string2);
      tx_string2 = nullptr;

      ret = CfdAddConfidentialTxSign(
        handle, tx_string, "57a15002d066ce52573d674df925c9bc0f1164849420705f2cfad8a68111230f", 0,
        true, multisig_script, false, &tx_string2);
      EXPECT_EQ(kCfdSuccess, ret);
    }
    if (ret == kCfdSuccess) {
      EXPECT_STREQ("0200000001020f231181a6d8fa2c5f7020948464110fbcc925f94d673d5752ce66d00250a1570000000000ffffffff0f231181a6d8fa2c5f7020948464110fbcc925f94d673d5752ce66d00250a1570100008000ffffffffd8bbe31bc590cbb6a47d2e53a956ec25d8890aefd60dcfc93efd34727554890b0683fe0819a4f9770c8a7cd5824e82975c825e017aff8ba0d6a5eb4959cf9c6f010000000023c346000004017981c1f171d7973a1fd922652f559f47d6d1506a4be2394b27a54951957f6c1801000000003b947f6002200d8510dfcf8e2330c0795c771d1e6064daab2f274ac32a6e2708df9bfa893d17a914ef3e40882e17d6e477082fcafeb0f09dc32d377b87010bad521bafdac767421d45b71b29a349c7b2ca2a06b5d8e3b5898c91df2769ed010000000029b9270002cc645552109331726c0ffadccab21620dd7a5a33260c6ac7bd1c78b98cb1e35a1976a9146c22e209d36612e0d9d2a20b814d7d8648cc7a7788ac017981c1f171d7973a1fd922652f559f47d6d1506a4be2394b27a54951957f6c1801000000000000c350000001cdb0ed311810e61036ac9255674101497850f5eee5e4320be07479c05473cbac010000000023c3460003ce4c4eac09fe317f365e45c00ffcf2e9639bc0fd792c10f72cdc173c4e5ed8791976a9149bdcb18911fa9faad6632ca43b81739082b0a19588ac00000000000004004730440220795dbf165d3197fe27e2b73d57cacfb8d742029c972b109040c7785aee4e75ea022065f7a985efe82eba1d0e0cafd7cf711bb8c65485bddc4e495315dd92bd7e4a790147304402202ce4acde192e4109832d46970b510158d42fc156c92afff137157ebfc2a03e2a02200b7dfd3a92770d79d29b3c55fb6325b22bce0e1362de74b2dac80d9689b5a89b0147522102bfd7daa5d113fcbd8c2f374ae58cbb89cbed9570e898f1af5ff989457e2d4d712102715ed9a5f16153c5216a6751b7d84eba32076f0b607550a58b209077ab7c30ad52ae00000000000000000000000000", tx_string2);
    }
    CfdFreeStringBuffer(sighash);

    CfdFreeStringBuffer(tx_string);
    CfdFreeStringBuffer(tx_string2);
  }

  ret = CfdGetLastErrorCode(handle);
  if (ret != kCfdSuccess) {
    char* str_buffer = NULL;
    ret = CfdGetLastErrorMessage(handle, &str_buffer);
    EXPECT_EQ(kCfdSuccess, ret);
    EXPECT_STREQ("", str_buffer);
    CfdFreeStringBuffer(str_buffer);
    str_buffer = NULL;
  }

  ret = CfdFreeHandle(handle);
  EXPECT_EQ(kCfdSuccess, ret);
}